

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_draw_list_alloc_vertices(nk_draw_list *list,nk_size count)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = nk_buffer_alloc(list->vertices,NK_BUFFER_FRONT,(list->config).vertex_size * count,
                           (list->config).vertex_alignment);
  pvVar2 = (void *)0x0;
  if (pvVar1 != (void *)0x0) {
    list->vertex_count = list->vertex_count + (int)count;
    pvVar2 = pvVar1;
  }
  return pvVar2;
}

Assistant:

NK_INTERN void*
nk_draw_list_alloc_vertices(struct nk_draw_list *list, nk_size count)
{
void *vtx;
NK_ASSERT(list);
if (!list) return 0;
vtx = nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT,
list->config.vertex_size*count, list->config.vertex_alignment);
if (!vtx) return 0;
list->vertex_count += (unsigned int)count;

/* This assert triggers because your are drawing a lot of stuff and nuklear
     * defined `nk_draw_index` as `nk_ushort` to safe space be default.
     *
     * So you reached the maximum number of indicies or rather vertexes.
     * To solve this issue please change typdef `nk_draw_index` to `nk_uint`
     * and don't forget to specify the new element size in your drawing
     * backend (OpenGL, DirectX, ...). For example in OpenGL for `glDrawElements`
     * instead of specifing `GL_UNSIGNED_SHORT` you have to define `GL_UNSIGNED_INT`.
     * Sorry for the inconvenience. */
if(sizeof(nk_draw_index)==2) NK_ASSERT((list->vertex_count < NK_USHORT_MAX &&
"To many verticies for 16-bit vertex indicies. Please read comment above on how to solve this problem"));
return vtx;
}